

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditDelibsTests.cpp
# Opt level: O1

int __thiscall dit::DepoolTests::init(DepoolTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"array",
             "dePoolArray_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)dePoolArray_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"heap",
             "dePoolHeap_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)dePoolHeap_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"hash",
             "dePoolHash_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)dePoolHash_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"set",
             "dePoolSet_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)dePoolSet_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"hash_set",
             "dePoolHashSet_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)dePoolHashSet_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"hash_array",
             "dePoolHashArray_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)dePoolHashArray_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCase::TestCase
            ((TestCase *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"multi_set",
             "dePoolMultiSet_selfTest()");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00272d58;
  pTVar1[1]._vptr_TestNode = (_func_int **)dePoolMultiSet_selfTest;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new SelfCheckCase(m_testCtx, "array",		"dePoolArray_selfTest()",		dePoolArray_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "heap",		"dePoolHeap_selfTest()",		dePoolHeap_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "hash",		"dePoolHash_selfTest()",		dePoolHash_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "set",		"dePoolSet_selfTest()",			dePoolSet_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "hash_set",	"dePoolHashSet_selfTest()",		dePoolHashSet_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "hash_array",	"dePoolHashArray_selfTest()",	dePoolHashArray_selfTest));
		addChild(new SelfCheckCase(m_testCtx, "multi_set",	"dePoolMultiSet_selfTest()",	dePoolMultiSet_selfTest));
	}